

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWaveBank_GetWaveProperties
                   (FACTWaveBank *pWaveBank,uint16_t nWaveIndex,FACTWaveProperties *pWaveProperties)

{
  code *pcVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  long in_RDX;
  ushort in_SI;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  FACTWaveBankEntry *entry;
  uint32_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x1152df);
    lVar4 = *(long *)(in_RDI + 0x38) + (ulong)in_SI * 0x18;
    if (*(long *)(in_RDI + 0x50) == 0) {
      SDL_memset(in_RDX,0,0x40);
    }
    else {
      SDL_memcpy(in_RDX,*(long *)(in_RDI + 0x50) + (long)(int)((uint)in_SI << 6),0x40);
    }
    *(undefined4 *)(in_RDX + 0x40) = *(undefined4 *)(lVar4 + 4);
    *(undefined4 *)(in_RDX + 0x44) = *(undefined4 *)(lVar4 + 0xc);
    if ((*(uint *)(lVar4 + 4) & 3) == 0) {
      *(int *)(in_RDX + 0x44) =
           (int)((ulong)*(uint *)(in_RDX + 0x44) /
                ((long)(8 << (byte)((uint)*(undefined4 *)(lVar4 + 4) >> 0x1f)) / 8 & 0xffffffffU));
      *(uint *)(in_RDX + 0x44) = *(uint *)(in_RDX + 0x44) / (*(uint *)(lVar4 + 4) >> 2 & 7);
    }
    else if ((*(uint *)(lVar4 + 4) & 3) == 2) {
      *(uint *)(in_RDX + 0x44) =
           (*(uint *)(in_RDX + 0x44) /
           (((*(uint *)(lVar4 + 4) >> 0x17 & 0xff) + 0x16) * (*(uint *)(lVar4 + 4) >> 2 & 7))) *
           ((*(uint *)(lVar4 + 4) >> 0x17 & 0xff) + 0x10) * 2;
    }
    else {
      do {
        iVar2 = SDL_ReportAssertion(&FACTWaveBank_GetWaveProperties::sdl_assert_data,
                                    "FACTWaveBank_GetWaveProperties",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                    ,0x6d2);
      } while (iVar2 == 0);
      if (iVar2 == 1) {
        pcVar1 = (code *)swi(3);
        uVar3 = (*pcVar1)();
        return uVar3;
      }
    }
    *(undefined8 *)(in_RDX + 0x48) = *(undefined8 *)(lVar4 + 0x10);
    *(uint *)(in_RDX + 0x50) = (uint)*(ushort *)(in_RDI + 0x5c);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1154b0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

uint32_t FACTWaveBank_GetWaveProperties(
	FACTWaveBank *pWaveBank,
	uint16_t nWaveIndex,
	FACTWaveProperties *pWaveProperties
) {
	FACTWaveBankEntry *entry;
	if (pWaveBank == NULL)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);

	entry = &pWaveBank->entries[nWaveIndex];

	if (pWaveBank->waveBankNames)
	{
		FAudio_memcpy(
			pWaveProperties->friendlyName,
			&pWaveBank->waveBankNames[nWaveIndex * 64],
			sizeof(pWaveProperties->friendlyName)
		);
	}
	else
	{
		FAudio_zero(
			pWaveProperties->friendlyName,
			sizeof(pWaveProperties->friendlyName)
		);
	}

	pWaveProperties->format = entry->Format;
	pWaveProperties->durationInSamples = entry->PlayRegion.dwLength;
	if (entry->Format.wFormatTag == 0)
	{
		pWaveProperties->durationInSamples /= (8 << entry->Format.wBitsPerSample) / 8;
		pWaveProperties->durationInSamples /= entry->Format.nChannels;
	}
	else if (entry->Format.wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		pWaveProperties->durationInSamples = (
			pWaveProperties->durationInSamples /
			((entry->Format.wBlockAlign + 22) * entry->Format.nChannels) *
			((entry->Format.wBlockAlign + 16) * 2)
		);
	}
	else
	{
		FAudio_assert(0 && "Unrecognized wFormatTag!");
	}

	pWaveProperties->loopRegion = entry->LoopRegion;
	pWaveProperties->streaming = pWaveBank->streaming;

	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
	return 0;
}